

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O3

int lj_cf_ffi_new(lua_State *L)

{
  uint uVar1;
  CTypeID id;
  CTInfo info;
  CTSize CVar2;
  undefined8 in_RAX;
  GCcdata *pGVar3;
  cTValue *pcVar4;
  TValue *pTVar5;
  ulong uVar6;
  GCtab *pGVar7;
  CType *ct;
  TValue *o_00;
  GCobj *o;
  CTState *cts;
  CTSize sz;
  undefined8 uStack_38;
  
  cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x194);
  cts->L = L;
  uStack_38 = in_RAX;
  id = ffi_checkctype(L,cts,(TValue *)0x0);
  ct = cts->tab + id;
  info = lj_ctype_info(cts,id,(CTSize *)((long)&uStack_38 + 4));
  if ((info >> 0x14 & 1) == 0) {
    o_00 = L->base + 1;
    CVar2 = uStack_38._4_4_;
  }
  else {
    o_00 = L->base + 2;
    CVar2 = ffi_checkint(L,2);
    CVar2 = lj_ctype_vlsize(cts,ct,CVar2);
    uStack_38 = CONCAT44(CVar2,(undefined4)uStack_38);
  }
  if (CVar2 == 0xffffffff) {
    lj_err_arg(L,1,LJ_ERR_FFI_INVSIZE);
  }
  pGVar3 = lj_cdata_newx(cts,id,CVar2,info);
  o_00[-1].u32.lo = (uint32_t)pGVar3;
  *(undefined4 *)((long)o_00 + -4) = 0xfffffff5;
  lj_cconv_ct_init(cts,ct,uStack_38._4_4_,(uint8_t *)(pGVar3 + 1),o_00,
                   (MSize)((ulong)((long)L->top - (long)o_00) >> 3));
  if (((((ct->info & 0xf0000000) == 0x10000000) &&
       (pcVar4 = lj_tab_getinth(cts->miscmap,-id), pcVar4 != (cTValue *)0x0)) &&
      ((pcVar4->field_2).it == 0xfffffff4)) &&
     (((pGVar7 = (GCtab *)(ulong)(pcVar4->u32).lo, pGVar7 != (GCtab *)0x0 &&
       ((pGVar7->nomm & 4) == 0)) &&
      (pcVar4 = lj_meta_cache(pGVar7,MM_gc,
                              (GCstr *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x1a0)),
      pcVar4 != (cTValue *)0x0)))) {
    uVar1 = *(uint *)((ulong)(L->glref).ptr32 + 0x230);
    pGVar7 = (GCtab *)(ulong)uVar1;
    if ((pGVar7->metatable).gcptr32 != 0) {
      pTVar5 = lj_tab_set(L,pGVar7,o_00 + -1);
      *pTVar5 = *pcVar4;
      if ((pGVar7->marked & 4) != 0) {
        uVar6 = (ulong)(L->glref).ptr32;
        pGVar7->marked = pGVar7->marked & 0xfb;
        (pGVar7->gclist).gcptr32 = *(uint32_t *)(uVar6 + 0x6c);
        *(uint *)(uVar6 + 0x6c) = uVar1;
      }
      pGVar3->marked = pGVar3->marked | 0x10;
    }
  }
  L->top = o_00;
  uVar6 = (ulong)(L->glref).ptr32;
  if (*(uint *)(uVar6 + 0x54) <= *(uint *)(uVar6 + 0x50)) {
    lj_gc_step(L);
  }
  return 1;
}

Assistant:

LJLIB_CF(ffi_new)	LJLIB_REC(.)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = ffi_checkctype(L, cts, NULL);
  CType *ct = ctype_raw(cts, id);
  CTSize sz;
  CTInfo info = lj_ctype_info(cts, id, &sz);
  TValue *o = L->base+1;
  GCcdata *cd;
  if ((info & CTF_VLA)) {
    o++;
    sz = lj_ctype_vlsize(cts, ct, (CTSize)ffi_checkint(L, 2));
  }
  if (sz == CTSIZE_INVALID)
    lj_err_arg(L, 1, LJ_ERR_FFI_INVSIZE);
  cd = lj_cdata_newx(cts, id, sz, info);
  setcdataV(L, o-1, cd);  /* Anchor the uninitialized cdata. */
  lj_cconv_ct_init(cts, ct, sz, cdataptr(cd),
		   o, (MSize)(L->top - o));  /* Initialize cdata. */
  if (ctype_isstruct(ct->info)) {
    /* Handle ctype __gc metamethod. Use the fast lookup here. */
    cTValue *tv = lj_tab_getinth(cts->miscmap, -(int32_t)id);
    if (tv && tvistab(tv) && (tv = lj_meta_fast(L, tabV(tv), MM_gc))) {
      GCtab *t = tabref(G(L)->gcroot[GCROOT_FFI_FIN]);
      if (gcref(t->metatable)) {
	/* Add to finalizer table, if still enabled. */
	copyTV(L, lj_tab_set(L, t, o-1), tv);
	lj_gc_anybarriert(L, t);
	cd->marked |= LJ_GC_CDATA_FIN;
      }
    }
  }
  L->top = o;  /* Only return the cdata itself. */
  lj_gc_check(L);
  return 1;
}